

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

bool __thiscall
SoftHSM::isMechanismPermitted(SoftHSM *this,OSObject *key,CK_MECHANISM_PTR pMechanism)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  ulong uVar3;
  _List_node_base *p_Var4;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *__x;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  bool bVar9;
  list<unsigned_long,_std::allocator<unsigned_long>_> mechs;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> allowed;
  OSAttribute attribute;
  list<unsigned_long,_std::allocator<unsigned_long>_> local_108;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_f0;
  OSAttribute local_c0;
  
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
            (&local_108,&this->supportedMechanisms);
  if (local_108.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)&local_108) {
    p_Var4 = local_108.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    do {
      if (p_Var4[1]._M_next == (_List_node_base *)pMechanism->mechanism) {
        if (p_Var4 != (_List_node_base *)&local_108) {
          (*key->_vptr_OSObject[3])(&local_c0,key,0x40000600);
          __x = &OSAttribute::getMechanismTypeSetValue(&local_c0)->_M_t;
          std::
          _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          ::_Rb_tree(&local_f0,__x);
          if (local_f0._M_impl.super__Rb_tree_header._M_node_count == 0) {
            bVar9 = true;
          }
          else {
            p_Var1 = &local_f0._M_impl.super__Rb_tree_header;
            p_Var8 = &p_Var1->_M_header;
            if (local_f0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
              uVar2 = pMechanism->mechanism;
              p_Var7 = &p_Var1->_M_header;
              do {
                p_Var5 = local_f0._M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var6 = p_Var7;
                uVar3 = *(ulong *)(p_Var5 + 1);
                p_Var7 = p_Var5;
                if (uVar3 < uVar2) {
                  p_Var7 = p_Var6;
                }
                local_f0._M_impl.super__Rb_tree_header._M_header._M_parent =
                     (&p_Var5->_M_left)[uVar3 < uVar2];
              } while ((&p_Var5->_M_left)[uVar3 < uVar2] != (_Base_ptr)0x0);
              if ((_Rb_tree_header *)p_Var7 != p_Var1) {
                if (uVar3 < uVar2) {
                  p_Var5 = p_Var6;
                }
                p_Var8 = p_Var7;
                if (uVar2 < *(ulong *)(p_Var5 + 1)) {
                  p_Var8 = &p_Var1->_M_header;
                }
              }
            }
            bVar9 = (_Rb_tree_header *)p_Var8 != p_Var1;
          }
          std::
          _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          ::~_Rb_tree(&local_f0);
          OSAttribute::~OSAttribute(&local_c0);
          goto LAB_00130287;
        }
        break;
      }
      p_Var4 = p_Var4->_M_next;
    } while (p_Var4 != (_List_node_base *)&local_108);
  }
  bVar9 = false;
LAB_00130287:
  if (local_108.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)&local_108) {
    do {
      p_Var4 = (local_108.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                _M_node.super__List_node_base._M_next)->_M_next;
      operator_delete(local_108.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl._M_node.super__List_node_base._M_next);
      local_108.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
      super__List_node_base._M_next = p_Var4;
    } while (p_Var4 != (_List_node_base *)&local_108);
  }
  return bVar9;
}

Assistant:

bool SoftHSM::isMechanismPermitted(OSObject* key, CK_MECHANISM_PTR pMechanism)
{
	std::list<CK_MECHANISM_TYPE> mechs = supportedMechanisms;
	/* First check if the algorithm is enabled in the global configuration */
	auto it = std::find(mechs.begin(), mechs.end(), pMechanism->mechanism);
	if (it == mechs.end())
		return false;

	OSAttribute attribute = key->getAttribute(CKA_ALLOWED_MECHANISMS);
	std::set<CK_MECHANISM_TYPE> allowed = attribute.getMechanismTypeSetValue();

	if (allowed.empty()) {
		return true;
	}

	return allowed.find(pMechanism->mechanism) != allowed.end();
}